

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
          (ExtensionSet *this,int start_field_number,int end_field_number,bool deterministic,
          uint8 *target)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  local_30;
  const_iterator iter;
  uint8 *target_local;
  int iStack_14;
  bool deterministic_local;
  int end_field_number_local;
  int start_field_number_local;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)target;
  iStack_14 = start_field_number;
  _end_field_number_local = this;
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  ::_Rb_tree_const_iterator(&local_30);
  local_38 = (_Base_ptr)
             std::
             map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
             ::lower_bound(&this->extensions_,&stack0xffffffffffffffec);
  local_30._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
         ::end(&this->extensions_);
    bVar2 = std::operator!=(&local_30,&local_40);
    bVar1 = false;
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_30);
      bVar1 = ppVar3->first < end_field_number;
    }
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    iter._M_node = (_Base_ptr)
                   Extension::InternalSerializeFieldWithCachedSizesToArray
                             (&ppVar3->second,ppVar4->first,deterministic,iter._M_node);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&local_30);
  }
  return (uint8 *)iter._M_node;
}

Assistant:

uint8* ExtensionSet::InternalSerializeWithCachedSizesToArray(
    int start_field_number, int end_field_number,
    bool deterministic, uint8* target) const {
  ExtensionMap::const_iterator iter;
  for (iter = extensions_.lower_bound(start_field_number);
       iter != extensions_.end() && iter->first < end_field_number;
       ++iter) {
    target = iter->second.InternalSerializeFieldWithCachedSizesToArray(
        iter->first, deterministic, target);
  }
  return target;
}